

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.h
# Opt level: O3

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ColSizeWriter::Write
          (ColSizeWriter *this,int s)

{
  if (this->kind_ == 2) {
    TextFormatter::apr(&this->nlw_->super_FormatterType,&this->nlw_->nm,"%d\n");
  }
  else if (this->kind_ == 1) {
    this->sum_ = (long)s + this->sum_;
    TextFormatter::apr(&this->nlw_->super_FormatterType,&this->nlw_->nm,"%z\n");
  }
  this->nWrt_ = this->nWrt_ + 1;
  return;
}

Assistant:

void Write(int s) {
      switch(kind_) {
      case 1:
        sum_ += s;
        nlw_.apr(nlw_.nm, "%z\n", sum_);
        break;
      case 2:
        nlw_.apr(nlw_.nm, "%d\n", s);
        break;
      default:
        assert(0 && "why am I here?");
      }
      ++nWrt_;
    }